

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  byte bVar3;
  ImRect local_28;
  
  pIVar1 = GImGui;
  if (((uint)window->Flags >> 0x10 & 1) == 0) {
    if (((((uint)window->Flags >> 0x1a & 1) != 0) || (window->RootWindow == window)) ||
       (window->NavLastIds[0] == 0 || force_reinit)) {
      bVar3 = 1;
    }
    else {
      bVar3 = 0;
    }
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n"
               ,(ulong)bVar3,window->Name,(ulong)GImGui->NavLayer);
    }
    if (bVar3 != 0) {
      local_28.Min.x = 0.0;
      local_28.Min.y = 0.0;
      local_28.Max.x = 0.0;
      local_28.Max.y = 0.0;
      SetNavID(0,pIVar1->NavLayer,window->NavRootFocusScopeId,&local_28);
      pIVar1->NavInitRequest = true;
      pIVar1->NavInitRequestFromMove = false;
      (pIVar1->NavInitResult).ID = 0;
      bVar2 = true;
      if (GImGui->NavMoveScoringItems == false) {
        bVar2 = GImGui->NavInitRequest;
      }
      GImGui->NavAnyRequest = bVar2;
      return;
    }
    pIVar1->NavId = window->NavLastIds[0];
  }
  else {
    GImGui->NavId = 0;
  }
  SetNavFocusScope(window->NavRootFocusScopeId);
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = 0;
        SetNavFocusScope(window->NavRootFocusScopeId);
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, window->NavRootFocusScopeId, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResult.ID = 0;
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        SetNavFocusScope(window->NavRootFocusScopeId);
    }
}